

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O3

void __thiscall
Lib::Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
~Recycled(Recycled<Lib::DArray<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          *this)

{
  Stack<std::unique_ptr<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>_>
  *this_00;
  unique_ptr<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
  *puVar1;
  _Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false> _Var2;
  
  _Var2._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
       .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (DArray<Kernel::Literal_*> *)0x0) {
    if (((_Var2._M_head_impl)->_capacity != 0) &&
       (Recycled<Lib::DArray<Kernel::Literal*>,Lib::DefaultReset,Lib::DefaultKeepRecycled>::memAlive
        == '\x01')) {
      DArray<Kernel::Literal_*>::ensure(_Var2._M_head_impl,0);
      this_00 = mem();
      _Var2._M_head_impl =
           (this->_self)._M_t.
           super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
           .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl;
      (this->_self)._M_t.
      super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
      .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl =
           (DArray<Kernel::Literal_*> *)0x0;
      puVar1 = this_00->_cursor;
      if (puVar1 == this_00->_end) {
        Stack<std::unique_ptr<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>_>
        ::expand(this_00);
        puVar1 = this_00->_cursor;
      }
      (puVar1->_M_t).
      super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
      .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl =
           _Var2._M_head_impl;
      this_00->_cursor = this_00->_cursor + 1;
      _Var2._M_head_impl =
           (this->_self)._M_t.
           super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
           .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl;
      if (_Var2._M_head_impl == (DArray<Kernel::Literal_*> *)0x0) goto LAB_004ec7fe;
    }
    std::default_delete<Lib::DArray<Kernel::Literal_*>_>::operator()
              ((default_delete<Lib::DArray<Kernel::Literal_*>_> *)this,_Var2._M_head_impl);
  }
LAB_004ec7fe:
  (this->_self)._M_t.
  super___uniq_ptr_impl<Lib::DArray<Kernel::Literal_*>,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::DArray<Kernel::Literal_*>_*,_std::default_delete<Lib::DArray<Kernel::Literal_*>_>_>
  .super__Head_base<0UL,_Lib::DArray<Kernel::Literal_*>_*,_false>._M_head_impl =
       (DArray<Kernel::Literal_*> *)0x0;
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }